

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenPadding(SwiftGenerator *this,FieldDef *field,int *id)

{
  int t;
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  string local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  FieldDef *local_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  CodeWriter *local_58;
  string local_50;
  
  if (field->padding != 0) {
    local_58 = &this->code_;
    uVar8 = 0;
    local_a0 = field;
    do {
      if (((uint)local_a0->padding >> (uVar8 & 0x1f) & 1) != 0) {
        t = *id;
        *id = t + 1;
        NumToString<int>(&local_50,t);
        plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3831ec);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_68 = *plVar3;
          lStack_60 = plVar1[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar3;
          local_78 = (long *)*plVar1;
        }
        local_70 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_78);
        puVar4 = (ulong *)(plVar1 + 2);
        if ((ulong *)*plVar1 == puVar4) {
          local_b0 = *puVar4;
          lStack_a8 = plVar1[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *puVar4;
          local_c0 = (ulong *)*plVar1;
        }
        local_b8 = plVar1[1];
        *plVar1 = (long)puVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        NumToString<int>(&local_e0,8 << ((byte)uVar8 & 0x1f));
        uVar6 = 0xf;
        if (local_c0 != &local_b0) {
          uVar6 = local_b0;
        }
        if (uVar6 < local_e0._M_string_length + local_b8) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            uVar7 = local_e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_e0._M_string_length + local_b8) goto LAB_002e5f01;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_002e5f01:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)local_e0._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        plVar1 = puVar2 + 2;
        if ((long *)*puVar2 == plVar1) {
          local_f0 = *plVar1;
          uStack_e8 = puVar2[3];
        }
        else {
          local_f0 = *plVar1;
          local_100 = (long *)*puVar2;
        }
        local_f8 = puVar2[1];
        *puVar2 = plVar1;
        puVar2[1] = 0;
        *(undefined1 *)plVar1 = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        psVar5 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98.field_2._8_8_ = plVar1[3];
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_98._M_string_length = plVar1[1];
        *plVar1 = (long)psVar5;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        CodeWriter::operator+=(local_58,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
    if (0xf < local_a0->padding) {
      __assert_fail("!(field.padding & ~0xF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                    ,0x6eb,
                    "void flatbuffers::swift::SwiftGenerator::GenPadding(const FieldDef &, int *)");
    }
  }
  return;
}

Assistant:

inline void GenPadding(const FieldDef &field, int *id) {
    if (field.padding) {
      for (int i = 0; i < 4; i++) {
        if (static_cast<int>(field.padding) & (1 << i)) {
          const auto bits = (1 << i) * 8;
          code_ += "private let padding" + NumToString((*id)++) + "__: UInt" +
                   NumToString(bits) + " = 0";
        }
      }
      FLATBUFFERS_ASSERT(!(field.padding & ~0xF));
    }
  }